

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int target_get_capabilities(TARGET_HANDLE target,AMQP_VALUE *capabilities_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  AMQP_VALUE pAVar4;
  bool bVar5;
  uint32_t item_count;
  char *capabilities_single_value;
  
  if (target == (TARGET_HANDLE)0x0) {
    iVar3 = 0x37ef;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(target->composite_value,&item_count);
    iVar3 = 0x37f7;
    if ((iVar1 == 0) && (iVar3 = 0x37fd, 6 < item_count)) {
      pAVar4 = amqpvalue_get_composite_item_in_place(target->composite_value,6);
      iVar3 = 0x3805;
      if ((pAVar4 != (AMQP_VALUE)0x0) &&
         (AVar2 = amqpvalue_get_type(pAVar4), AVar2 != AMQP_TYPE_NULL)) {
        AVar2 = amqpvalue_get_type(pAVar4);
        if (AVar2 == AMQP_TYPE_ARRAY) {
          capabilities_single_value = (char *)0x0;
          bVar5 = true;
        }
        else {
          iVar3 = amqpvalue_get_symbol(pAVar4,&capabilities_single_value);
          bVar5 = iVar3 != 0;
        }
        AVar2 = amqpvalue_get_type(pAVar4);
        if (AVar2 == AMQP_TYPE_ARRAY) {
          iVar3 = amqpvalue_get_array(pAVar4,capabilities_value);
          if ((bool)(iVar3 != 0 & bVar5)) {
            return 0x3818;
          }
        }
        else if (bVar5) {
          return 0x3818;
        }
        AVar2 = amqpvalue_get_type(pAVar4);
        iVar3 = 0;
        if (AVar2 != AMQP_TYPE_ARRAY) {
          pAVar4 = amqpvalue_create_array();
          *capabilities_value = pAVar4;
          if (pAVar4 == (AMQP_VALUE)0x0) {
            iVar3 = 0x3821;
          }
          else {
            pAVar4 = amqpvalue_create_symbol(capabilities_single_value);
            if (pAVar4 == (AMQP_VALUE)0x0) {
              iVar3 = 0x3828;
            }
            else {
              iVar1 = amqpvalue_add_array_item(*capabilities_value,pAVar4);
              iVar3 = 0x382e;
              if (iVar1 == 0) {
                iVar1 = amqpvalue_set_composite_item(target->composite_value,6,*capabilities_value);
                iVar3 = 0x3834;
                if (iVar1 == 0) {
                  iVar3 = 0;
                }
              }
              amqpvalue_destroy(pAVar4);
            }
            amqpvalue_destroy(*capabilities_value);
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int target_get_capabilities(TARGET_HANDLE target, AMQP_VALUE* capabilities_value)
{
    int result;

    if (target == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        TARGET_INSTANCE* target_instance = (TARGET_INSTANCE*)target;
        if (amqpvalue_get_composite_item_count(target_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 6)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(target_instance->composite_value, 6);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    const char* capabilities_single_value;
                    int get_single_value_result;
                    if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                    {
                        get_single_value_result = amqpvalue_get_symbol(item_value, &capabilities_single_value);
                    }
                    else
                    {
                        (void)memset((void*)&capabilities_single_value, 0, sizeof(capabilities_single_value));
                        get_single_value_result = 1;
                    }

                    if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, capabilities_value) != 0)) &&
                        (get_single_value_result != 0))
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                        {
                            *capabilities_value = amqpvalue_create_array();
                            if (*capabilities_value == NULL)
                            {
                                result = MU_FAILURE;
                            }
                            else
                            {
                                AMQP_VALUE single_amqp_value = amqpvalue_create_symbol(capabilities_single_value);
                                if (single_amqp_value == NULL)
                                {
                                    result = MU_FAILURE;
                                }
                                else
                                {
                                    if (amqpvalue_add_array_item(*capabilities_value, single_amqp_value) != 0)
                                    {
                                        result = MU_FAILURE;
                                    }
                                    else
                                    {
                                        if (amqpvalue_set_composite_item(target_instance->composite_value, 6, *capabilities_value) != 0)
                                        {
                                            result = MU_FAILURE;
                                        }
                                        else
                                        {
                                            result = 0;
                                        }
                                    }

                                    amqpvalue_destroy(single_amqp_value);
                                }
                                amqpvalue_destroy(*capabilities_value);
                            }
                        }
                        else
                        {
                            result = 0;
                        }
                    }
                }
            }
        }
    }

    return result;
}